

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall CommandLineArguments::setShuffle(CommandLineArguments *this,int ac,char **av,int *i)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  int *in_RCX;
  int in_ESI;
  long in_RDI;
  byte bVar4;
  uint parsedParameter;
  SimpleString shuffleParameter;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  *(undefined1 *)(in_RDI + 0x21) = 1;
  uVar2 = (*GetPlatformSpecificTimeInMillis)();
  *(ulong *)(in_RDI + 0x30) = uVar2 & 0xffffffff;
  if (*(long *)(in_RDI + 0x30) == 0) {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  }
  SimpleString::SimpleString
            ((SimpleString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  sVar3 = SimpleString::size((SimpleString *)0x187f7e);
  if (sVar3 < 3) {
    if ((*in_RCX + 1 < in_ESI) &&
       (uVar1 = SimpleString::AtoU((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                    in_stack_ffffffffffffffa0)), uVar1 != 0)) {
      *(undefined1 *)(in_RDI + 0x22) = 1;
      *(ulong *)(in_RDI + 0x30) = (ulong)uVar1;
      *in_RCX = *in_RCX + 1;
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x22) = 1;
    uVar1 = SimpleString::AtoU((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                              );
    *(ulong *)(in_RDI + 0x30) = (ulong)uVar1;
  }
  bVar4 = *(long *)(in_RDI + 0x30) != 0;
  SimpleString::~SimpleString((SimpleString *)0x18805f);
  return (bool)(bVar4 & 1);
}

Assistant:

bool CommandLineArguments::setShuffle(int ac, const char * const *av, int& i)
{
    shuffling_ = true;
    shuffleSeed_ = (unsigned int)GetPlatformSpecificTimeInMillis();
    if (shuffleSeed_ == 0) shuffleSeed_++;

    SimpleString shuffleParameter = av[i];
    if (shuffleParameter.size() > 2) {
        shufflingPreSeeded_ = true;
        shuffleSeed_ = SimpleString::AtoU(av[i] + 2);
    } else if (i + 1 < ac) {
        unsigned int parsedParameter = SimpleString::AtoU(av[i + 1]);
        if (parsedParameter != 0)
        {
            shufflingPreSeeded_ = true;
            shuffleSeed_ = parsedParameter;
            i++;
        }
    }
    return (shuffleSeed_ != 0);
}